

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugger.cpp
# Opt level: O2

void cs_debugger_func_callback(string *decl,statement_base *stmt)

{
  element_type *peVar1;
  pointer puVar2;
  ulong uVar3;
  string *psVar4;
  size_t sVar5;
  MappedReference<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_cs::csym_info>_>
  pcVar6;
  ostream *poVar7;
  
  peVar1 = ((context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar4 = cs::statement_base::get_file_path_abi_cxx11_(stmt);
  sVar5 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>
          ::count<std::__cxx11::string>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>
                      *)&peVar1->csyms,psVar4);
  if (sVar5 == 0) {
    poVar7 = std::operator<<((ostream *)&std::cout,"\nHit breakpoint, at \"");
    psVar4 = cs::statement_base::get_file_path_abi_cxx11_(stmt);
    poVar7 = std::operator<<(poVar7,(string *)psVar4);
    poVar7 = std::operator<<(poVar7,"\", line ");
  }
  else {
    peVar1 = ((context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    psVar4 = cs::statement_base::get_file_path_abi_cxx11_(stmt);
    pcVar6 = phmap::priv::
             raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>
             ::
             operator[]<std::__cxx11::string,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>>
                       ((raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>
                         *)&peVar1->csyms,psVar4);
    puVar2 = (pcVar6->map).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((ulong)((long)(pcVar6->map).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2 >> 3) <= stmt->line_num) {
      return;
    }
    uVar3 = puVar2[stmt->line_num - 1];
    if (uVar3 == 0) {
      return;
    }
    if ((ulong)((long)(pcVar6->codes).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pcVar6->codes).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar3) {
      return;
    }
    poVar7 = std::operator<<((ostream *)&std::cout,"\nHit breakpoint, at \"");
    poVar7 = std::operator<<(poVar7,(string *)pcVar6);
    poVar7 = std::operator<<(poVar7,"\", line ");
  }
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  poVar7 = std::operator<<(poVar7,", ");
  poVar7 = std::operator<<(poVar7,(string *)decl);
  std::endl<char,std::char_traits<char>>(poVar7);
  current_level = *(long *)(cs::current_process + 0x88) - *(long *)(cs::current_process + 0x80) >> 3
  ;
  exec_by_step = true;
  return;
}

Assistant:

void cs_debugger_func_callback(const std::string &decl, cs::statement_base *stmt)
{
	if (context->compiler->csyms.count(stmt->get_file_path()) > 0) {
		cs::csym_info &csym = context->compiler->csyms[stmt->get_file_path()];
		std::size_t current_line = stmt->get_line_num();
		if (current_line >= csym.map.size())
			return;
		std::size_t actual_line = csym.map[current_line - 1];
		if (actual_line >= csym.codes.size() || actual_line == 0)
			return;
		std::cout << "\nHit breakpoint, at \"" << csym.file << "\", line " << actual_line << ", " << decl << std::endl;
	}
	else
		std::cout << "\nHit breakpoint, at \"" << stmt->get_file_path() << "\", line " << stmt->get_line_num() << ", " << decl << std::endl;
	current_level = cs::current_process->stack.size();
	exec_by_step = true;
}